

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5bf3::TestCheckArray2DCloseFailureBecauseOfExceptionContainsCorrectDetails::
RunImpl(TestCheckArray2DCloseFailureBecauseOfExceptionContainsCorrectDetails *this)

{
  TestResults *pTVar1;
  TestDetails **ppTVar2;
  float *pfVar3;
  TestResults **ppTVar4;
  TestDetails *details;
  TestDetails *this_00;
  int line;
  TestDetails testDetails;
  ScopedCurrentTest scopedResults;
  TestDetails local_870;
  TestResults testResults;
  RecordingReporter reporter;
  
  line = 0;
  reporter.super_TestReporter._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150820;
  reporter.testRunCount = 0;
  reporter.testFailedCount = 0;
  reporter.lastFailedLine = 0;
  reporter.testFinishedCount = 0;
  reporter.lastStartedSuite[0] = '\0';
  reporter.lastStartedTest[0] = '\0';
  reporter.lastFailedFile[0] = '\0';
  reporter.lastFailedSuite[0] = '\0';
  reporter.lastFailedTest[0] = '\0';
  reporter.lastFailedMessage[0] = '\0';
  reporter.lastFinishedSuite[0] = '\0';
  reporter.lastFinishedTest[0] = '\0';
  reporter.lastFinishedTestTime = 0.0;
  reporter.summaryTotalTestCount = 0;
  reporter.summaryFailedTestCount = 0;
  reporter.summaryFailureCount = 0;
  reporter.summarySecondsElapsed = 0.0;
  UnitTest::TestResults::TestResults(&testResults,&reporter.super_TestReporter);
  UnitTest::TestDetails::TestDetails
            (&testDetails,"array2DCloseTest","array2DCloseSuite","filename",-1);
  ScopedCurrentTest::ScopedCurrentTest(&scopedResults,&testResults,&testDetails);
  UnitTest::CurrentTest::Results();
  ppTVar2 = UnitTest::CurrentTest::Details();
  details = *ppTVar2;
  this_00 = &local_870;
  UnitTest::TestDetails::TestDetails(this_00,details,0x2c4);
  pfVar3 = ThrowingObject2D::operator[]((ThrowingObject2D *)this_00,(int)details);
  __cxa_begin_catch(pfVar3);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar2,0x2c4);
  UnitTest::TestResults::OnTestFailure
            (pTVar1,&local_870,"Unhandled exception in CHECK_ARRAY_CLOSE(data, ThrowingObject2D())")
  ;
  __cxa_end_catch();
  line = 0x2c4;
  ScopedCurrentTest::~ScopedCurrentTest(&scopedResults);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&testDetails,*ppTVar2,0x2c7);
  UnitTest::CheckEqual(pTVar1,"array2DCloseTest",reporter.lastFailedTest,&testDetails);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&testDetails,*ppTVar2,0x2c8);
  UnitTest::CheckEqual(pTVar1,"array2DCloseSuite",reporter.lastFailedSuite,&testDetails);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&testDetails,*ppTVar2,0x2c9);
  UnitTest::CheckEqual(pTVar1,"filename",reporter.lastFailedFile,&testDetails);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&testDetails,*ppTVar2,0x2ca);
  UnitTest::CheckEqual<int,int>(pTVar1,&line,&reporter.lastFailedLine,&testDetails);
  UnitTest::TestReporter::~TestReporter(&reporter.super_TestReporter);
  return;
}

Assistant:

TEST(CheckArray2DCloseFailureBecauseOfExceptionContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("array2DCloseTest", "array2DCloseSuite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		const float data[2][2] = { {0, 1}, {2, 3} };
        CHECK_ARRAY2D_CLOSE (data, ThrowingObject2D(), 2, 2, 0.01f);   line = __LINE__;
    }

    CHECK_EQUAL("array2DCloseTest", reporter.lastFailedTest);
    CHECK_EQUAL("array2DCloseSuite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}